

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O1

string * __thiscall
wabt::cat<char[8],std::__cxx11::string,char[2],char_const*>
          (string *__return_storage_ptr__,wabt *this,char (*args) [8],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [2],char **args_3)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cat_compute_size<char[8],std::__cxx11::string,char[2],char_const*>
            ((char (*) [8])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [2])args_1,(char **)args_2);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cat_concatenate<std::__cxx11::string,char[2],char_const*>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (char (*) [2])args_1,(char **)args_2);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
    std::string s;
    s.reserve(cat_compute_size(args...));
    cat_concatenate(s, args...);
    return s;
}